

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  undefined1 (*pauVar6) [16];
  undefined4 uVar7;
  undefined4 uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  NodeRef *pNVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  float fVar40;
  float fVar41;
  undefined1 auVar28 [16];
  float fVar42;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar43;
  float fVar59;
  float fVar60;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar61;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar62;
  float fVar69;
  float fVar70;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar71;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  float fVar82;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar89;
  float fVar91;
  undefined1 auVar90 [16];
  float fVar92;
  float fVar93;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar102;
  float fVar103;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar114;
  float fVar115;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar116 [16];
  float fVar125;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar126;
  float fVar127;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar136;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 local_b88 [8];
  float fStack_b80;
  float fStack_b7c;
  undefined1 local_b68 [16];
  undefined1 (*local_b58) [16];
  long local_b50;
  long local_b48;
  undefined1 (*local_b40) [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined1 local_af8 [8];
  float fStack_af0;
  float fStack_aec;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined1 local_a08 [12];
  float fStack_9fc;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  undefined1 local_9e8 [8];
  float fStack_9e0;
  float fStack_9dc;
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [8];
  float fStack_970;
  float fStack_96c;
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined4 local_928;
  undefined4 uStack_924;
  undefined4 uStack_920;
  undefined4 uStack_91c;
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined4 local_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined1 local_8e8 [16];
  undefined4 local_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  uint local_8c8;
  uint uStack_8c4;
  uint uStack_8c0;
  uint uStack_8bc;
  uint local_8b8;
  uint uStack_8b4;
  uint uStack_8b0;
  uint uStack_8ac;
  uint local_8a8;
  uint uStack_8a4;
  uint uStack_8a0;
  uint uStack_89c;
  int local_898;
  int iStack_894;
  int iStack_890;
  int iStack_88c;
  undefined1 local_888 [16];
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  uVar15 = mm_lookupmask_ps._248_8_;
  uVar14 = mm_lookupmask_ps._240_8_;
  pNVar22 = stack + 1;
  stack[0] = root;
  local_7f8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_808 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_818 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_828 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_838 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_848 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_868 = local_828 * 0.99999964;
  local_878 = local_838 * 0.99999964;
  local_858 = local_848 * 0.99999964;
  local_828 = local_828 * 1.0000004;
  local_838 = local_838 * 1.0000004;
  local_848 = local_848 * 1.0000004;
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar16 = (tray->tnear).field_0.i[k];
  local_888._4_4_ = iVar16;
  local_888._0_4_ = iVar16;
  local_888._8_4_ = iVar16;
  local_888._12_4_ = iVar16;
  local_898 = (tray->tfar).field_0.i[k];
  local_7e8 = mm_lookupmask_ps._0_16_;
  local_b58 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar26 = true;
  iStack_894 = local_898;
  iStack_890 = local_898;
  iStack_88c = local_898;
  fStack_7f4 = local_7f8;
  fStack_7f0 = local_7f8;
  fStack_7ec = local_7f8;
  fStack_804 = local_808;
  fStack_800 = local_808;
  fStack_7fc = local_808;
  fStack_814 = local_818;
  fStack_810 = local_818;
  fStack_80c = local_818;
  fStack_824 = local_828;
  fStack_820 = local_828;
  fStack_81c = local_828;
  fStack_834 = local_838;
  fStack_830 = local_838;
  fStack_82c = local_838;
  fStack_844 = local_848;
  fStack_840 = local_848;
  fStack_83c = local_848;
  fStack_854 = local_858;
  fStack_850 = local_858;
  fStack_84c = local_858;
  fStack_864 = local_868;
  fStack_860 = local_868;
  fStack_85c = local_868;
  fStack_874 = local_878;
  fStack_870 = local_878;
  fStack_86c = local_878;
  local_b40 = local_b58;
  do {
    uVar20 = pNVar22[-1].ptr;
    pNVar22 = pNVar22 + -1;
    while ((uVar20 & 8) == 0) {
      pfVar1 = (float *)(uVar20 + 0x20 + uVar23);
      auVar46._0_4_ = (*pfVar1 - local_7f8) * local_868;
      auVar46._4_4_ = (pfVar1[1] - fStack_7f4) * fStack_864;
      auVar46._8_4_ = (pfVar1[2] - fStack_7f0) * fStack_860;
      auVar46._12_4_ = (pfVar1[3] - fStack_7ec) * fStack_85c;
      pfVar1 = (float *)(uVar20 + 0x20 + uVar24);
      auVar44._0_4_ = (*pfVar1 - local_808) * local_878;
      auVar44._4_4_ = (pfVar1[1] - fStack_804) * fStack_874;
      auVar44._8_4_ = (pfVar1[2] - fStack_800) * fStack_870;
      auVar44._12_4_ = (pfVar1[3] - fStack_7fc) * fStack_86c;
      auVar28 = maxps(auVar46,auVar44);
      pfVar1 = (float *)(uVar20 + 0x20 + uVar25);
      auVar45._0_4_ = (*pfVar1 - local_818) * local_858;
      auVar45._4_4_ = (pfVar1[1] - fStack_814) * fStack_854;
      auVar45._8_4_ = (pfVar1[2] - fStack_810) * fStack_850;
      auVar45._12_4_ = (pfVar1[3] - fStack_80c) * fStack_84c;
      auVar46 = maxps(auVar45,local_888);
      auVar46 = maxps(auVar28,auVar46);
      pfVar1 = (float *)(uVar20 + 0x20 + (uVar23 ^ 0x10));
      auVar47._0_4_ = (*pfVar1 - local_7f8) * local_828;
      auVar47._4_4_ = (pfVar1[1] - fStack_7f4) * fStack_824;
      auVar47._8_4_ = (pfVar1[2] - fStack_7f0) * fStack_820;
      auVar47._12_4_ = (pfVar1[3] - fStack_7ec) * fStack_81c;
      pfVar1 = (float *)(uVar20 + 0x20 + (uVar24 ^ 0x10));
      auVar63._0_4_ = (*pfVar1 - local_808) * local_838;
      auVar63._4_4_ = (pfVar1[1] - fStack_804) * fStack_834;
      auVar63._8_4_ = (pfVar1[2] - fStack_800) * fStack_830;
      auVar63._12_4_ = (pfVar1[3] - fStack_7fc) * fStack_82c;
      auVar48 = minps(auVar47,auVar63);
      pfVar1 = (float *)(uVar20 + 0x20 + (uVar25 ^ 0x10));
      auVar64._0_4_ = (*pfVar1 - local_818) * local_848;
      auVar64._4_4_ = (pfVar1[1] - fStack_814) * fStack_844;
      auVar64._8_4_ = (pfVar1[2] - fStack_810) * fStack_840;
      auVar64._12_4_ = (pfVar1[3] - fStack_80c) * fStack_83c;
      auVar28._4_4_ = iStack_894;
      auVar28._0_4_ = local_898;
      auVar28._8_4_ = iStack_890;
      auVar28._12_4_ = iStack_88c;
      auVar28 = minps(auVar64,auVar28);
      auVar28 = minps(auVar48,auVar28);
      auVar48._4_4_ = -(uint)(auVar46._4_4_ <= auVar28._4_4_);
      auVar48._0_4_ = -(uint)(auVar46._0_4_ <= auVar28._0_4_);
      auVar48._8_4_ = -(uint)(auVar46._8_4_ <= auVar28._8_4_);
      auVar48._12_4_ = -(uint)(auVar46._12_4_ <= auVar28._12_4_);
      uVar19 = movmskps((int)local_b58,auVar48);
      local_b58 = (undefined1 (*) [16])(ulong)uVar19;
      if (uVar19 == 0) goto LAB_00277d56;
      uVar17 = uVar20 & 0xfffffffffffffff0;
      lVar18 = 0;
      if ((byte)uVar19 != 0) {
        for (; ((byte)uVar19 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
        }
      }
      uVar20 = *(ulong *)(uVar17 + lVar18 * 8);
      uVar19 = (uVar19 & 0xff) - 1 & uVar19 & 0xff;
      local_b58 = (undefined1 (*) [16])(ulong)uVar19;
      if (uVar19 != 0) {
        pNVar22->ptr = uVar20;
        pNVar22 = pNVar22 + 1;
        lVar18 = 0;
        if (local_b58 != (undefined1 (*) [16])0x0) {
          for (; (uVar19 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
        uVar20 = *(ulong *)(uVar17 + lVar18 * 8);
        uVar19 = uVar19 - 1 & uVar19;
        uVar21 = (ulong)uVar19;
        if (uVar19 != 0) {
          do {
            pNVar22->ptr = uVar20;
            pNVar22 = pNVar22 + 1;
            local_b58 = (undefined1 (*) [16])0x0;
            if (uVar21 != 0) {
              for (; (uVar21 >> (long)local_b58 & 1) == 0;
                  local_b58 = (undefined1 (*) [16])(*local_b58 + 1)) {
              }
            }
            uVar20 = *(ulong *)(uVar17 + (long)local_b58 * 8);
            uVar21 = uVar21 & uVar21 - 1;
          } while (uVar21 != 0);
        }
      }
    }
    local_b50 = (ulong)((uint)uVar20 & 0xf) - 8;
    if (local_b50 != 0) {
      uVar20 = uVar20 & 0xfffffffffffffff0;
      local_b48 = 0;
      do {
        lVar18 = local_b48 * 0xe0;
        puVar5 = (undefined8 *)(uVar20 + 0xd0 + lVar18);
        local_a18 = *puVar5;
        uStack_a10 = puVar5[1];
        fVar113 = *(float *)(ray + k * 4);
        fVar71 = *(float *)(ray + k * 4 + 0x10);
        fVar61 = *(float *)(ray + k * 4 + 0x20);
        pfVar1 = (float *)(uVar20 + lVar18);
        pfVar2 = (float *)(uVar20 + 0x10 + lVar18);
        pfVar3 = (float *)(uVar20 + 0x20 + lVar18);
        pfVar4 = (float *)(uVar20 + 0x30 + lVar18);
        local_a28 = *(undefined8 *)pfVar4;
        uStack_a20 = *(undefined8 *)(pfVar4 + 2);
        fVar92 = *pfVar1 - fVar113;
        fVar96 = pfVar1[1] - fVar113;
        fVar98 = pfVar1[2] - fVar113;
        fVar100 = pfVar1[3] - fVar113;
        fVar136 = *pfVar2 - fVar71;
        fVar139 = pfVar2[1] - fVar71;
        fVar140 = pfVar2[2] - fVar71;
        fVar141 = pfVar2[3] - fVar71;
        fVar142 = *pfVar3 - fVar61;
        fVar144 = pfVar3[1] - fVar61;
        fVar146 = pfVar3[2] - fVar61;
        fVar148 = pfVar3[3] - fVar61;
        fVar102 = *pfVar4 - fVar113;
        fVar108 = pfVar4[1] - fVar113;
        fVar110 = pfVar4[2] - fVar113;
        fVar112 = pfVar4[3] - fVar113;
        pfVar1 = (float *)(uVar20 + 0x40 + lVar18);
        local_a48 = *(undefined8 *)pfVar1;
        uStack_a40 = *(undefined8 *)(pfVar1 + 2);
        fVar81 = *pfVar1 - fVar71;
        fVar86 = pfVar1[1] - fVar71;
        fVar87 = pfVar1[2] - fVar71;
        fVar88 = pfVar1[3] - fVar71;
        pfVar1 = (float *)(uVar20 + 0x50 + lVar18);
        local_a38 = *(undefined8 *)pfVar1;
        uStack_a30 = *(undefined8 *)(pfVar1 + 2);
        fVar72 = *pfVar1 - fVar61;
        fVar73 = pfVar1[1] - fVar61;
        fVar74 = pfVar1[2] - fVar61;
        fVar75 = pfVar1[3] - fVar61;
        pfVar1 = (float *)(uVar20 + 0x90 + lVar18);
        local_b08 = *(undefined8 *)pfVar1;
        uStack_b00 = *(undefined8 *)(pfVar1 + 2);
        fVar103 = *pfVar1 - fVar113;
        fVar109 = pfVar1[1] - fVar113;
        fVar111 = pfVar1[2] - fVar113;
        fVar113 = pfVar1[3] - fVar113;
        pfVar1 = (float *)(uVar20 + 0xa0 + lVar18);
        local_a58 = *(undefined8 *)pfVar1;
        uStack_a50 = *(undefined8 *)(pfVar1 + 2);
        fVar62 = *pfVar1 - fVar71;
        fVar69 = pfVar1[1] - fVar71;
        fVar70 = pfVar1[2] - fVar71;
        fVar71 = pfVar1[3] - fVar71;
        pauVar6 = (undefined1 (*) [16])(uVar20 + 0xb0 + lVar18);
        _local_b88 = *pauVar6;
        fVar43 = *(float *)*pauVar6 - fVar61;
        fVar59 = *(float *)(*pauVar6 + 4) - fVar61;
        fVar60 = *(float *)(*pauVar6 + 8) - fVar61;
        fVar61 = *(float *)(*pauVar6 + 0xc) - fVar61;
        fVar126 = fVar103 - fVar92;
        fVar130 = fVar109 - fVar96;
        fVar132 = fVar111 - fVar98;
        fVar134 = fVar113 - fVar100;
        fVar157 = fVar62 - fVar136;
        fVar158 = fVar69 - fVar139;
        fVar159 = fVar70 - fVar140;
        fVar160 = fVar71 - fVar141;
        fVar150 = fVar43 - fVar142;
        fVar153 = fVar59 - fVar144;
        fVar154 = fVar60 - fVar146;
        fVar156 = fVar61 - fVar148;
        fVar125 = *(float *)(ray + k * 4 + 0x50);
        fVar155 = *(float *)(ray + k * 4 + 0x60);
        fVar82 = *(float *)(ray + k * 4 + 0x40);
        fVar89 = (fVar157 * (fVar142 + fVar43) - (fVar136 + fVar62) * fVar150) * fVar82 +
                 ((fVar92 + fVar103) * fVar150 - (fVar142 + fVar43) * fVar126) * fVar125 +
                 (fVar126 * (fVar136 + fVar62) - (fVar92 + fVar103) * fVar157) * fVar155;
        fVar91 = (fVar158 * (fVar144 + fVar59) - (fVar139 + fVar69) * fVar153) * fVar82 +
                 ((fVar96 + fVar109) * fVar153 - (fVar144 + fVar59) * fVar130) * fVar125 +
                 (fVar130 * (fVar139 + fVar69) - (fVar96 + fVar109) * fVar158) * fVar155;
        local_a08._0_8_ = CONCAT44(fVar91,fVar89);
        local_a08._8_4_ =
             (fVar159 * (fVar146 + fVar60) - (fVar140 + fVar70) * fVar154) * fVar82 +
             ((fVar98 + fVar111) * fVar154 - (fVar146 + fVar60) * fVar132) * fVar125 +
             (fVar132 * (fVar140 + fVar70) - (fVar98 + fVar111) * fVar159) * fVar155;
        fStack_9fc = (fVar160 * (fVar148 + fVar61) - (fVar141 + fVar71) * fVar156) * fVar82 +
                     ((fVar100 + fVar113) * fVar156 - (fVar148 + fVar61) * fVar134) * fVar125 +
                     (fVar134 * (fVar141 + fVar71) - (fVar100 + fVar113) * fVar160) * fVar155;
        fVar127 = fVar92 - fVar102;
        fVar131 = fVar96 - fVar108;
        fVar133 = fVar98 - fVar110;
        fVar135 = fVar100 - fVar112;
        fVar114 = fVar136 - fVar81;
        fVar119 = fVar139 - fVar86;
        fVar121 = fVar140 - fVar87;
        fVar123 = fVar141 - fVar88;
        fVar27 = fVar142 - fVar72;
        fVar40 = fVar144 - fVar73;
        fVar41 = fVar146 - fVar74;
        fVar42 = fVar148 - fVar75;
        auVar83._0_4_ =
             (fVar114 * (fVar142 + fVar72) - (fVar136 + fVar81) * fVar27) * fVar82 +
             ((fVar92 + fVar102) * fVar27 - (fVar142 + fVar72) * fVar127) * fVar125 +
             (fVar127 * (fVar136 + fVar81) - (fVar92 + fVar102) * fVar114) * fVar155;
        auVar83._4_4_ =
             (fVar119 * (fVar144 + fVar73) - (fVar139 + fVar86) * fVar40) * fVar82 +
             ((fVar96 + fVar108) * fVar40 - (fVar144 + fVar73) * fVar131) * fVar125 +
             (fVar131 * (fVar139 + fVar86) - (fVar96 + fVar108) * fVar119) * fVar155;
        auVar83._8_4_ =
             (fVar121 * (fVar146 + fVar74) - (fVar140 + fVar87) * fVar41) * fVar82 +
             ((fVar98 + fVar110) * fVar41 - (fVar146 + fVar74) * fVar133) * fVar125 +
             (fVar133 * (fVar140 + fVar87) - (fVar98 + fVar110) * fVar121) * fVar155;
        auVar83._12_4_ =
             (fVar123 * (fVar148 + fVar75) - (fVar141 + fVar88) * fVar42) * fVar82 +
             ((fVar100 + fVar112) * fVar42 - (fVar148 + fVar75) * fVar135) * fVar125 +
             (fVar135 * (fVar141 + fVar88) - (fVar100 + fVar112) * fVar123) * fVar155;
        fVar115 = fVar102 - fVar103;
        fVar120 = fVar108 - fVar109;
        fVar122 = fVar110 - fVar111;
        fVar124 = fVar112 - fVar113;
        fVar143 = fVar81 - fVar62;
        fVar145 = fVar86 - fVar69;
        fVar147 = fVar87 - fVar70;
        fVar149 = fVar88 - fVar71;
        fVar93 = fVar72 - fVar43;
        fVar97 = fVar73 - fVar59;
        fVar99 = fVar74 - fVar60;
        fVar101 = fVar75 - fVar61;
        auVar137._0_4_ =
             (fVar143 * (fVar43 + fVar72) - (fVar62 + fVar81) * fVar93) * fVar82 +
             ((fVar103 + fVar102) * fVar93 - (fVar43 + fVar72) * fVar115) * fVar125 +
             (fVar115 * (fVar62 + fVar81) - (fVar103 + fVar102) * fVar143) * fVar155;
        auVar137._4_4_ =
             (fVar145 * (fVar59 + fVar73) - (fVar69 + fVar86) * fVar97) * fVar82 +
             ((fVar109 + fVar108) * fVar97 - (fVar59 + fVar73) * fVar120) * fVar125 +
             (fVar120 * (fVar69 + fVar86) - (fVar109 + fVar108) * fVar145) * fVar155;
        auVar137._8_4_ =
             (fVar147 * (fVar60 + fVar74) - (fVar70 + fVar87) * fVar99) * fVar82 +
             ((fVar111 + fVar110) * fVar99 - (fVar60 + fVar74) * fVar122) * fVar125 +
             (fVar122 * (fVar70 + fVar87) - (fVar111 + fVar110) * fVar147) * fVar155;
        auVar137._12_4_ =
             (fVar149 * (fVar61 + fVar75) - (fVar71 + fVar88) * fVar101) * fVar82 +
             ((fVar113 + fVar112) * fVar101 - (fVar61 + fVar75) * fVar124) * fVar125 +
             (fVar124 * (fVar71 + fVar88) - (fVar113 + fVar112) * fVar149) * fVar155;
        local_9e8._0_4_ = auVar83._0_4_ + fVar89 + auVar137._0_4_;
        local_9e8._4_4_ = auVar83._4_4_ + fVar91 + auVar137._4_4_;
        fStack_9e0 = auVar83._8_4_ + (float)local_a08._8_4_ + auVar137._8_4_;
        fStack_9dc = auVar83._12_4_ + fStack_9fc + auVar137._12_4_;
        auVar29._8_4_ = local_a08._8_4_;
        auVar29._0_8_ = local_a08._0_8_;
        auVar29._12_4_ = fStack_9fc;
        auVar28 = minps(auVar29,auVar83);
        auVar28 = minps(auVar28,auVar137);
        auVar104._8_4_ = local_a08._8_4_;
        auVar104._0_8_ = local_a08._0_8_;
        auVar104._12_4_ = fStack_9fc;
        auVar46 = maxps(auVar104,auVar83);
        auVar46 = maxps(auVar46,auVar137);
        fVar113 = ABS((float)local_9e8._0_4_) * 1.1920929e-07;
        fVar71 = ABS((float)local_9e8._4_4_) * 1.1920929e-07;
        fVar61 = ABS(fStack_9e0) * 1.1920929e-07;
        fVar43 = ABS(fStack_9dc) * 1.1920929e-07;
        auVar105._4_4_ = -(uint)(auVar46._4_4_ <= fVar71);
        auVar105._0_4_ = -(uint)(auVar46._0_4_ <= fVar113);
        auVar105._8_4_ = -(uint)(auVar46._8_4_ <= fVar61);
        auVar105._12_4_ = -(uint)(auVar46._12_4_ <= fVar43);
        auVar30._4_4_ = -(uint)(-fVar71 <= auVar28._4_4_);
        auVar30._0_4_ = -(uint)(-fVar113 <= auVar28._0_4_);
        auVar30._8_4_ = -(uint)(-fVar61 <= auVar28._8_4_);
        auVar30._12_4_ = -(uint)(-fVar43 <= auVar28._12_4_);
        auVar105 = auVar105 | auVar30;
        local_b58 = (undefined1 (*) [16])(uVar20 + lVar18);
        iVar16 = movmskps((int)lVar18,auVar105);
        if (iVar16 != 0) {
          auVar84._0_4_ = fVar157 * fVar27 - fVar114 * fVar150;
          auVar84._4_4_ = fVar158 * fVar40 - fVar119 * fVar153;
          auVar84._8_4_ = fVar159 * fVar41 - fVar121 * fVar154;
          auVar84._12_4_ = fVar160 * fVar42 - fVar123 * fVar156;
          auVar128._0_4_ = fVar114 * fVar93 - fVar27 * fVar143;
          auVar128._4_4_ = fVar119 * fVar97 - fVar40 * fVar145;
          auVar128._8_4_ = fVar121 * fVar99 - fVar41 * fVar147;
          auVar128._12_4_ = fVar123 * fVar101 - fVar42 * fVar149;
          auVar31._4_4_ = -(uint)(ABS(fVar119 * fVar153) < ABS(fVar40 * fVar145));
          auVar31._0_4_ = -(uint)(ABS(fVar114 * fVar150) < ABS(fVar27 * fVar143));
          auVar31._8_4_ = -(uint)(ABS(fVar121 * fVar154) < ABS(fVar41 * fVar147));
          auVar31._12_4_ = -(uint)(ABS(fVar123 * fVar156) < ABS(fVar42 * fVar149));
          local_9d8 = blendvps(auVar128,auVar84,auVar31);
          auVar116._0_4_ = fVar150 * fVar127 - fVar27 * fVar126;
          auVar116._4_4_ = fVar153 * fVar131 - fVar40 * fVar130;
          auVar116._8_4_ = fVar154 * fVar133 - fVar41 * fVar132;
          auVar116._12_4_ = fVar156 * fVar135 - fVar42 * fVar134;
          auVar76._0_4_ = fVar27 * fVar115 - fVar127 * fVar93;
          auVar76._4_4_ = fVar40 * fVar120 - fVar131 * fVar97;
          auVar76._8_4_ = fVar41 * fVar122 - fVar133 * fVar99;
          auVar76._12_4_ = fVar42 * fVar124 - fVar135 * fVar101;
          auVar32._4_4_ = -(uint)(ABS(fVar40 * fVar130) < ABS(fVar131 * fVar97));
          auVar32._0_4_ = -(uint)(ABS(fVar27 * fVar126) < ABS(fVar127 * fVar93));
          auVar32._8_4_ = -(uint)(ABS(fVar41 * fVar132) < ABS(fVar133 * fVar99));
          auVar32._12_4_ = -(uint)(ABS(fVar42 * fVar134) < ABS(fVar135 * fVar101));
          local_9c8 = blendvps(auVar76,auVar116,auVar32);
          auVar94._0_4_ = fVar126 * fVar114 - fVar127 * fVar157;
          auVar94._4_4_ = fVar130 * fVar119 - fVar131 * fVar158;
          auVar94._8_4_ = fVar132 * fVar121 - fVar133 * fVar159;
          auVar94._12_4_ = fVar134 * fVar123 - fVar135 * fVar160;
          auVar79._0_4_ = fVar127 * fVar143 - fVar114 * fVar115;
          auVar79._4_4_ = fVar131 * fVar145 - fVar119 * fVar120;
          auVar79._8_4_ = fVar133 * fVar147 - fVar121 * fVar122;
          auVar79._12_4_ = fVar135 * fVar149 - fVar123 * fVar124;
          auVar33._4_4_ = -(uint)(ABS(fVar131 * fVar158) < ABS(fVar119 * fVar120));
          auVar33._0_4_ = -(uint)(ABS(fVar127 * fVar157) < ABS(fVar114 * fVar115));
          auVar33._8_4_ = -(uint)(ABS(fVar133 * fVar159) < ABS(fVar121 * fVar122));
          auVar33._12_4_ = -(uint)(ABS(fVar135 * fVar160) < ABS(fVar123 * fVar124));
          local_9b8 = blendvps(auVar79,auVar94,auVar33);
          fVar113 = fVar82 * local_9d8._0_4_ + fVar125 * local_9c8._0_4_ + fVar155 * local_9b8._0_4_
          ;
          fVar71 = fVar82 * local_9d8._4_4_ + fVar125 * local_9c8._4_4_ + fVar155 * local_9b8._4_4_;
          fVar61 = fVar82 * local_9d8._8_4_ + fVar125 * local_9c8._8_4_ + fVar155 * local_9b8._8_4_;
          fVar125 = fVar82 * local_9d8._12_4_ +
                    fVar125 * local_9c8._12_4_ + fVar155 * local_9b8._12_4_;
          auVar117._0_4_ = fVar113 + fVar113;
          auVar117._4_4_ = fVar71 + fVar71;
          auVar117._8_4_ = fVar61 + fVar61;
          auVar117._12_4_ = fVar125 + fVar125;
          auVar49._0_4_ = fVar142 * local_9b8._0_4_;
          auVar49._4_4_ = fVar144 * local_9b8._4_4_;
          auVar49._8_4_ = fVar146 * local_9b8._8_4_;
          auVar49._12_4_ = fVar148 * local_9b8._12_4_;
          fVar41 = fVar92 * local_9d8._0_4_ + fVar136 * local_9c8._0_4_ + auVar49._0_4_;
          fVar42 = fVar96 * local_9d8._4_4_ + fVar139 * local_9c8._4_4_ + auVar49._4_4_;
          fVar43 = fVar98 * local_9d8._8_4_ + fVar140 * local_9c8._8_4_ + auVar49._8_4_;
          fVar59 = fVar100 * local_9d8._12_4_ + fVar141 * local_9c8._12_4_ + auVar49._12_4_;
          auVar28 = rcpps(auVar49,auVar117);
          fVar113 = auVar28._0_4_;
          fVar71 = auVar28._4_4_;
          fVar125 = auVar28._8_4_;
          fVar155 = auVar28._12_4_;
          fVar82 = (float)DAT_01f7ba10;
          fVar27 = DAT_01f7ba10._4_4_;
          fVar40 = DAT_01f7ba10._12_4_;
          fVar61 = DAT_01f7ba10._8_4_;
          local_978._0_4_ =
               ((fVar82 - auVar117._0_4_ * fVar113) * fVar113 + fVar113) * (fVar41 + fVar41);
          local_978._4_4_ =
               ((fVar27 - auVar117._4_4_ * fVar71) * fVar71 + fVar71) * (fVar42 + fVar42);
          fStack_970 = ((fVar61 - auVar117._8_4_ * fVar125) * fVar125 + fVar125) * (fVar43 + fVar43)
          ;
          fStack_96c = ((fVar40 - auVar117._12_4_ * fVar155) * fVar155 + fVar155) *
                       (fVar59 + fVar59);
          fVar113 = *(float *)(ray + k * 4 + 0x80);
          fVar71 = *(float *)(ray + k * 4 + 0x30);
          auVar65._4_4_ = -(uint)(fVar71 <= (float)local_978._4_4_);
          auVar65._0_4_ = -(uint)(fVar71 <= (float)local_978._0_4_);
          auVar65._8_4_ = -(uint)(fVar71 <= fStack_970);
          auVar65._12_4_ = -(uint)(fVar71 <= fStack_96c);
          auVar50._0_4_ =
               -(uint)((float)local_978._0_4_ <= fVar113 && fVar71 <= (float)local_978._0_4_) &
               auVar105._0_4_;
          auVar50._4_4_ =
               -(uint)((float)local_978._4_4_ <= fVar113 && fVar71 <= (float)local_978._4_4_) &
               auVar105._4_4_;
          auVar50._8_4_ = -(uint)(fStack_970 <= fVar113 && fVar71 <= fStack_970) & auVar105._8_4_;
          auVar50._12_4_ = -(uint)(fStack_96c <= fVar113 && fVar71 <= fStack_96c) & auVar105._12_4_;
          iVar16 = movmskps(iVar16,auVar50);
          if (iVar16 != 0) {
            local_9a8._0_4_ = auVar50._0_4_ & -(uint)(auVar117._0_4_ != 0.0);
            local_9a8._4_4_ = auVar50._4_4_ & -(uint)(auVar117._4_4_ != 0.0);
            local_9a8._8_4_ = auVar50._8_4_ & -(uint)(auVar117._8_4_ != 0.0);
            local_9a8._12_4_ = auVar50._12_4_ & -(uint)(auVar117._12_4_ != 0.0);
            iVar16 = movmskps(iVar16,local_9a8);
            if (iVar16 != 0) {
              local_9f8 = auVar83._0_4_;
              fStack_9f4 = auVar83._4_4_;
              fStack_9f0 = auVar83._8_4_;
              fStack_9ec = auVar83._12_4_;
              local_938 = local_7e8;
              pSVar9 = context->scene;
              auVar12._4_4_ = local_9e8._4_4_;
              auVar12._0_4_ = local_9e8._0_4_;
              auVar12._8_4_ = fStack_9e0;
              auVar12._12_4_ = fStack_9dc;
              auVar28 = rcpps(auVar65,auVar12);
              fVar71 = auVar28._0_4_;
              fVar125 = auVar28._4_4_;
              fVar155 = auVar28._8_4_;
              fVar41 = auVar28._12_4_;
              fVar71 = (float)(-(uint)(1e-18 <= ABS((float)local_9e8._0_4_)) &
                              (uint)((fVar82 - (float)local_9e8._0_4_ * fVar71) * fVar71 + fVar71));
              fVar125 = (float)(-(uint)(1e-18 <= ABS((float)local_9e8._4_4_)) &
                               (uint)((fVar27 - (float)local_9e8._4_4_ * fVar125) * fVar125 +
                                     fVar125));
              fVar155 = (float)(-(uint)(1e-18 <= ABS(fStack_9e0)) &
                               (uint)((fVar61 - fStack_9e0 * fVar155) * fVar155 + fVar155));
              fVar41 = (float)(-(uint)(1e-18 <= ABS(fStack_9dc)) &
                              (uint)((fVar40 - fStack_9dc * fVar41) * fVar41 + fVar41));
              auVar90._0_4_ = fVar89 * fVar71;
              auVar90._4_4_ = fVar91 * fVar125;
              auVar90._8_4_ = (float)local_a08._8_4_ * fVar155;
              auVar90._12_4_ = fStack_9fc * fVar41;
              auVar28 = minps(auVar90,_DAT_01f7ba10);
              auVar151._0_4_ = fVar71 * auVar83._0_4_;
              auVar151._4_4_ = fVar125 * auVar83._4_4_;
              auVar151._8_4_ = fVar155 * auVar83._8_4_;
              auVar151._12_4_ = fVar41 * auVar83._12_4_;
              auVar46 = minps(auVar151,_DAT_01f7ba10);
              auVar51._0_4_ = fVar82 - auVar28._0_4_;
              auVar51._4_4_ = fVar27 - auVar28._4_4_;
              auVar51._8_4_ = fVar61 - auVar28._8_4_;
              auVar51._12_4_ = fVar40 - auVar28._12_4_;
              auVar66._0_4_ = fVar82 - auVar46._0_4_;
              auVar66._4_4_ = fVar27 - auVar46._4_4_;
              auVar66._8_4_ = fVar61 - auVar46._8_4_;
              auVar66._12_4_ = fVar40 - auVar46._12_4_;
              local_998 = blendvps(auVar28,auVar51,local_7e8);
              local_988 = blendvps(auVar46,auVar66,local_7e8);
              local_968 = local_9d8;
              local_958 = local_9c8;
              local_948 = local_9b8;
              uVar17 = (ulong)(byte)iVar16;
              do {
                uVar21 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                local_8c8 = *(uint *)(local_b58[0xc] + uVar21 * 4);
                pGVar10 = (pSVar9->geometries).items[local_8c8].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00277d76;
                  local_8f8 = *(undefined4 *)(local_998 + uVar21 * 4);
                  uVar7 = *(undefined4 *)(local_988 + uVar21 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_978 + uVar21 * 4);
                  args.context = context->user;
                  local_8d8 = *(undefined4 *)((long)&local_a18 + uVar21 * 4);
                  local_8e8._4_4_ = uVar7;
                  local_8e8._0_4_ = uVar7;
                  local_8e8._8_4_ = uVar7;
                  local_8e8._12_4_ = uVar7;
                  local_928 = *(undefined4 *)(local_968 + uVar21 * 4);
                  uVar7 = *(undefined4 *)(local_958 + uVar21 * 4);
                  uVar8 = *(undefined4 *)(local_948 + uVar21 * 4);
                  local_918._4_4_ = uVar7;
                  local_918._0_4_ = uVar7;
                  local_918._8_4_ = uVar7;
                  local_918._12_4_ = uVar7;
                  local_908._4_4_ = uVar8;
                  local_908._0_4_ = uVar8;
                  local_908._8_4_ = uVar8;
                  local_908._12_4_ = uVar8;
                  uStack_924 = local_928;
                  uStack_920 = local_928;
                  uStack_91c = local_928;
                  uStack_8f4 = local_8f8;
                  uStack_8f0 = local_8f8;
                  uStack_8ec = local_8f8;
                  uStack_8d4 = local_8d8;
                  uStack_8d0 = local_8d8;
                  uStack_8cc = local_8d8;
                  uStack_8c4 = local_8c8;
                  uStack_8c0 = local_8c8;
                  uStack_8bc = local_8c8;
                  local_8b8 = (args.context)->instID[0];
                  uStack_8b4 = local_8b8;
                  uStack_8b0 = local_8b8;
                  uStack_8ac = local_8b8;
                  local_8a8 = (args.context)->instPrimID[0];
                  uStack_8a4 = local_8a8;
                  uStack_8a0 = local_8a8;
                  uStack_89c = local_8a8;
                  local_b68 = *local_b40;
                  args.valid = (int *)local_b68;
                  args.geometryUserPtr = pGVar10->userPtr;
                  args.hit = (RTCHitN *)&local_928;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&args);
                  }
                  if (local_b68 == (undefined1  [16])0x0) {
                    auVar52._8_4_ = 0xffffffff;
                    auVar52._0_8_ = 0xffffffffffffffff;
                    auVar52._12_4_ = 0xffffffff;
                    auVar52 = auVar52 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&args);
                    }
                    auVar34._0_4_ = -(uint)(local_b68._0_4_ == 0);
                    auVar34._4_4_ = -(uint)(local_b68._4_4_ == 0);
                    auVar34._8_4_ = -(uint)(local_b68._8_4_ == 0);
                    auVar34._12_4_ = -(uint)(local_b68._12_4_ == 0);
                    auVar52 = auVar34 ^ _DAT_01f7ae20;
                    auVar28 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar34
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar28;
                  }
                  if ((_DAT_01f7bb20 & auVar52) != (undefined1  [16])0x0) goto LAB_00277d76;
                  *(float *)(ray + k * 4 + 0x80) = fVar113;
                }
                uVar17 = uVar17 ^ 1L << (uVar21 & 0x3f);
              } while (uVar17 != 0);
              local_a28 = *(undefined8 *)local_b58[3];
              uStack_a20 = *(undefined8 *)(local_b58[3] + 8);
              local_a48 = *(undefined8 *)local_b58[4];
              uStack_a40 = *(undefined8 *)(local_b58[4] + 8);
              local_a38 = *(undefined8 *)local_b58[5];
              uStack_a30 = *(undefined8 *)(local_b58[5] + 8);
              local_b08 = *(undefined8 *)local_b58[9];
              uStack_b00 = *(undefined8 *)(local_b58[9] + 8);
              local_a58 = *(undefined8 *)local_b58[10];
              uStack_a50 = *(undefined8 *)(local_b58[10] + 8);
              _local_b88 = local_b58[0xb];
              iVar16 = 0;
            }
          }
        }
        fVar113 = *(float *)(ray + k * 4);
        fVar71 = *(float *)(ray + k * 4 + 0x10);
        fVar61 = *(float *)(ray + k * 4 + 0x20);
        fVar114 = *(float *)local_b58[6] - fVar113;
        fVar115 = *(float *)(local_b58[6] + 4) - fVar113;
        fVar119 = *(float *)(local_b58[6] + 8) - fVar113;
        fVar120 = *(float *)(local_b58[6] + 0xc) - fVar113;
        fVar126 = *(float *)local_b58[7] - fVar71;
        fVar127 = *(float *)(local_b58[7] + 4) - fVar71;
        fVar130 = *(float *)(local_b58[7] + 8) - fVar71;
        fVar131 = *(float *)(local_b58[7] + 0xc) - fVar71;
        fVar93 = *(float *)local_b58[8] - fVar61;
        fVar96 = *(float *)(local_b58[8] + 4) - fVar61;
        fVar97 = *(float *)(local_b58[8] + 8) - fVar61;
        fVar98 = *(float *)(local_b58[8] + 0xc) - fVar61;
        local_b08._0_4_ = (float)local_b08 - fVar113;
        local_b08._4_4_ = local_b08._4_4_ - fVar113;
        uStack_b00._0_4_ = (float)uStack_b00 - fVar113;
        uStack_b00._4_4_ = uStack_b00._4_4_ - fVar113;
        local_a58._0_4_ = (float)local_a58 - fVar71;
        local_a58._4_4_ = local_a58._4_4_ - fVar71;
        uStack_a50._0_4_ = (float)uStack_a50 - fVar71;
        uStack_a50._4_4_ = uStack_a50._4_4_ - fVar71;
        fVar125 = (float)local_b88._0_4_ - fVar61;
        fVar155 = (float)local_b88._4_4_ - fVar61;
        fStack_b80 = fStack_b80 - fVar61;
        fStack_b7c = fStack_b7c - fVar61;
        local_a28._0_4_ = (float)local_a28 - fVar113;
        local_a28._4_4_ = local_a28._4_4_ - fVar113;
        uStack_a20._0_4_ = (float)uStack_a20 - fVar113;
        uStack_a20._4_4_ = uStack_a20._4_4_ - fVar113;
        local_a48._0_4_ = (float)local_a48 - fVar71;
        local_a48._4_4_ = local_a48._4_4_ - fVar71;
        uStack_a40._0_4_ = (float)uStack_a40 - fVar71;
        uStack_a40._4_4_ = uStack_a40._4_4_ - fVar71;
        local_a38._0_4_ = (float)local_a38 - fVar61;
        local_a38._4_4_ = local_a38._4_4_ - fVar61;
        uStack_a30._0_4_ = (float)uStack_a30 - fVar61;
        uStack_a30._4_4_ = uStack_a30._4_4_ - fVar61;
        fVar70 = (float)local_a28 - fVar114;
        fVar74 = local_a28._4_4_ - fVar115;
        fVar86 = (float)uStack_a20 - fVar119;
        fVar89 = uStack_a20._4_4_ - fVar120;
        fVar132 = (float)local_a48 - fVar126;
        fVar133 = local_a48._4_4_ - fVar127;
        fVar134 = (float)uStack_a40 - fVar130;
        fVar135 = uStack_a40._4_4_ - fVar131;
        fVar109 = (float)local_a38 - fVar93;
        fVar110 = local_a38._4_4_ - fVar96;
        fVar111 = (float)uStack_a30 - fVar97;
        fVar112 = uStack_a30._4_4_ - fVar98;
        fVar113 = *(float *)(ray + k * 4 + 0x50);
        fVar71 = *(float *)(ray + k * 4 + 0x60);
        fVar61 = *(float *)(ray + k * 4 + 0x40);
        fVar99 = (fVar132 * (fVar93 + (float)local_a38) - (fVar126 + (float)local_a48) * fVar109) *
                 fVar61 + ((fVar114 + (float)local_a28) * fVar109 -
                          (fVar93 + (float)local_a38) * fVar70) * fVar113 +
                          (fVar70 * (fVar126 + (float)local_a48) -
                          (fVar114 + (float)local_a28) * fVar132) * fVar71;
        fVar100 = (fVar133 * (fVar96 + local_a38._4_4_) - (fVar127 + local_a48._4_4_) * fVar110) *
                  fVar61 + ((fVar115 + local_a28._4_4_) * fVar110 -
                           (fVar96 + local_a38._4_4_) * fVar74) * fVar113 +
                           (fVar74 * (fVar127 + local_a48._4_4_) -
                           (fVar115 + local_a28._4_4_) * fVar133) * fVar71;
        local_a08._0_8_ = CONCAT44(fVar100,fVar99);
        local_a08._8_4_ =
             (fVar134 * (fVar97 + (float)uStack_a30) - (fVar130 + (float)uStack_a40) * fVar111) *
             fVar61 + ((fVar119 + (float)uStack_a20) * fVar111 -
                      (fVar97 + (float)uStack_a30) * fVar86) * fVar113 +
                      (fVar86 * (fVar130 + (float)uStack_a40) -
                      (fVar119 + (float)uStack_a20) * fVar134) * fVar71;
        fStack_9fc = (fVar135 * (fVar98 + uStack_a30._4_4_) - (fVar131 + uStack_a40._4_4_) * fVar112
                     ) * fVar61 +
                     ((fVar120 + uStack_a20._4_4_) * fVar112 - (fVar98 + uStack_a30._4_4_) * fVar89)
                     * fVar113 +
                     (fVar89 * (fVar131 + uStack_a40._4_4_) - (fVar120 + uStack_a20._4_4_) * fVar135
                     ) * fVar71;
        fVar72 = fVar114 - (float)local_b08;
        fVar75 = fVar115 - local_b08._4_4_;
        fVar87 = fVar119 - (float)uStack_b00;
        fVar91 = fVar120 - uStack_b00._4_4_;
        fVar40 = fVar126 - (float)local_a58;
        fVar41 = fVar127 - local_a58._4_4_;
        fVar42 = fVar130 - (float)uStack_a50;
        fVar43 = fVar131 - uStack_a50._4_4_;
        fVar101 = fVar93 - fVar125;
        fVar102 = fVar96 - fVar155;
        fVar103 = fVar97 - fStack_b80;
        fVar108 = fVar98 - fStack_b7c;
        auVar77._0_4_ =
             (fVar40 * (fVar93 + fVar125) - (fVar126 + (float)local_a58) * fVar101) * fVar61 +
             ((fVar114 + (float)local_b08) * fVar101 - (fVar93 + fVar125) * fVar72) * fVar113 +
             (fVar72 * (fVar126 + (float)local_a58) - (fVar114 + (float)local_b08) * fVar40) *
             fVar71;
        auVar77._4_4_ =
             (fVar41 * (fVar96 + fVar155) - (fVar127 + local_a58._4_4_) * fVar102) * fVar61 +
             ((fVar115 + local_b08._4_4_) * fVar102 - (fVar96 + fVar155) * fVar75) * fVar113 +
             (fVar75 * (fVar127 + local_a58._4_4_) - (fVar115 + local_b08._4_4_) * fVar41) * fVar71;
        auVar77._8_4_ =
             (fVar42 * (fVar97 + fStack_b80) - (fVar130 + (float)uStack_a50) * fVar103) * fVar61 +
             ((fVar119 + (float)uStack_b00) * fVar103 - (fVar97 + fStack_b80) * fVar87) * fVar113 +
             (fVar87 * (fVar130 + (float)uStack_a50) - (fVar119 + (float)uStack_b00) * fVar42) *
             fVar71;
        auVar77._12_4_ =
             (fVar43 * (fVar98 + fStack_b7c) - (fVar131 + uStack_a50._4_4_) * fVar108) * fVar61 +
             ((fVar120 + uStack_b00._4_4_) * fVar108 - (fVar98 + fStack_b7c) * fVar91) * fVar113 +
             (fVar91 * (fVar131 + uStack_a50._4_4_) - (fVar120 + uStack_b00._4_4_) * fVar43) *
             fVar71;
        fVar59 = (float)local_b08 - (float)local_a28;
        fVar60 = local_b08._4_4_ - local_a28._4_4_;
        fVar62 = (float)uStack_b00 - (float)uStack_a20;
        fVar69 = uStack_b00._4_4_ - uStack_a20._4_4_;
        fVar73 = (float)local_a58 - (float)local_a48;
        fVar81 = local_a58._4_4_ - local_a48._4_4_;
        fVar88 = (float)uStack_a50 - (float)uStack_a40;
        fVar92 = uStack_a50._4_4_ - uStack_a40._4_4_;
        fVar121 = fVar125 - (float)local_a38;
        fVar122 = fVar155 - local_a38._4_4_;
        fVar123 = fStack_b80 - (float)uStack_a30;
        fVar124 = fStack_b7c - uStack_a30._4_4_;
        auVar35._0_4_ =
             (fVar73 * ((float)local_a38 + fVar125) -
             ((float)local_a48 + (float)local_a58) * fVar121) * fVar61 +
             (((float)local_a28 + (float)local_b08) * fVar121 -
             ((float)local_a38 + fVar125) * fVar59) * fVar113 +
             (fVar59 * ((float)local_a48 + (float)local_a58) -
             ((float)local_a28 + (float)local_b08) * fVar73) * fVar71;
        auVar35._4_4_ =
             (fVar81 * (local_a38._4_4_ + fVar155) - (local_a48._4_4_ + local_a58._4_4_) * fVar122)
             * fVar61 +
             ((local_a28._4_4_ + local_b08._4_4_) * fVar122 - (local_a38._4_4_ + fVar155) * fVar60)
             * fVar113 +
             (fVar60 * (local_a48._4_4_ + local_a58._4_4_) -
             (local_a28._4_4_ + local_b08._4_4_) * fVar81) * fVar71;
        auVar35._8_4_ =
             (fVar88 * ((float)uStack_a30 + fStack_b80) -
             ((float)uStack_a40 + (float)uStack_a50) * fVar123) * fVar61 +
             (((float)uStack_a20 + (float)uStack_b00) * fVar123 -
             ((float)uStack_a30 + fStack_b80) * fVar62) * fVar113 +
             (fVar62 * ((float)uStack_a40 + (float)uStack_a50) -
             ((float)uStack_a20 + (float)uStack_b00) * fVar88) * fVar71;
        auVar35._12_4_ =
             (fVar92 * (uStack_a30._4_4_ + fStack_b7c) -
             (uStack_a40._4_4_ + uStack_a50._4_4_) * fVar124) * fVar61 +
             ((uStack_a20._4_4_ + uStack_b00._4_4_) * fVar124 -
             (uStack_a30._4_4_ + fStack_b7c) * fVar69) * fVar113 +
             (fVar69 * (uStack_a40._4_4_ + uStack_a50._4_4_) -
             (uStack_a20._4_4_ + uStack_b00._4_4_) * fVar92) * fVar71;
        local_af8._0_4_ = auVar77._0_4_ + fVar99 + auVar35._0_4_;
        local_af8._4_4_ = auVar77._4_4_ + fVar100 + auVar35._4_4_;
        fStack_af0 = auVar77._8_4_ + (float)local_a08._8_4_ + auVar35._8_4_;
        fStack_aec = auVar77._12_4_ + fStack_9fc + auVar35._12_4_;
        auVar53._8_4_ = local_a08._8_4_;
        auVar53._0_8_ = local_a08._0_8_;
        auVar53._12_4_ = fStack_9fc;
        auVar28 = minps(auVar53,auVar77);
        auVar28 = minps(auVar28,auVar35);
        auVar106._8_4_ = local_a08._8_4_;
        auVar106._0_8_ = local_a08._0_8_;
        auVar106._12_4_ = fStack_9fc;
        auVar46 = maxps(auVar106,auVar77);
        auVar46 = maxps(auVar46,auVar35);
        fVar125 = ABS((float)local_af8._0_4_) * 1.1920929e-07;
        fVar155 = ABS((float)local_af8._4_4_) * 1.1920929e-07;
        fVar82 = ABS(fStack_af0) * 1.1920929e-07;
        fVar27 = ABS(fStack_aec) * 1.1920929e-07;
        auVar107._4_4_ = -(uint)(auVar46._4_4_ <= fVar155);
        auVar107._0_4_ = -(uint)(auVar46._0_4_ <= fVar125);
        auVar107._8_4_ = -(uint)(auVar46._8_4_ <= fVar82);
        auVar107._12_4_ = -(uint)(auVar46._12_4_ <= fVar27);
        auVar54._4_4_ = -(uint)(-fVar155 <= auVar28._4_4_);
        auVar54._0_4_ = -(uint)(-fVar125 <= auVar28._0_4_);
        auVar54._8_4_ = -(uint)(-fVar82 <= auVar28._8_4_);
        auVar54._12_4_ = -(uint)(-fVar27 <= auVar28._12_4_);
        auVar107 = auVar107 | auVar54;
        iVar16 = movmskps(iVar16,auVar107);
        lVar18 = local_b48;
        if (iVar16 != 0) {
          auVar129._0_4_ = fVar132 * fVar101 - fVar40 * fVar109;
          auVar129._4_4_ = fVar133 * fVar102 - fVar41 * fVar110;
          auVar129._8_4_ = fVar134 * fVar103 - fVar42 * fVar111;
          auVar129._12_4_ = fVar135 * fVar108 - fVar43 * fVar112;
          auVar138._0_4_ = fVar40 * fVar121 - fVar101 * fVar73;
          auVar138._4_4_ = fVar41 * fVar122 - fVar102 * fVar81;
          auVar138._8_4_ = fVar42 * fVar123 - fVar103 * fVar88;
          auVar138._12_4_ = fVar43 * fVar124 - fVar108 * fVar92;
          auVar36._4_4_ = -(uint)(ABS(fVar41 * fVar110) < ABS(fVar102 * fVar81));
          auVar36._0_4_ = -(uint)(ABS(fVar40 * fVar109) < ABS(fVar101 * fVar73));
          auVar36._8_4_ = -(uint)(ABS(fVar42 * fVar111) < ABS(fVar103 * fVar88));
          auVar36._12_4_ = -(uint)(ABS(fVar43 * fVar112) < ABS(fVar108 * fVar92));
          local_9d8 = blendvps(auVar138,auVar129,auVar36);
          auVar80._0_4_ = fVar109 * fVar72 - fVar101 * fVar70;
          auVar80._4_4_ = fVar110 * fVar75 - fVar102 * fVar74;
          auVar80._8_4_ = fVar111 * fVar87 - fVar103 * fVar86;
          auVar80._12_4_ = fVar112 * fVar91 - fVar108 * fVar89;
          auVar85._0_4_ = fVar101 * fVar59 - fVar72 * fVar121;
          auVar85._4_4_ = fVar102 * fVar60 - fVar75 * fVar122;
          auVar85._8_4_ = fVar103 * fVar62 - fVar87 * fVar123;
          auVar85._12_4_ = fVar108 * fVar69 - fVar91 * fVar124;
          auVar37._4_4_ = -(uint)(ABS(fVar102 * fVar74) < ABS(fVar75 * fVar122));
          auVar37._0_4_ = -(uint)(ABS(fVar101 * fVar70) < ABS(fVar72 * fVar121));
          auVar37._8_4_ = -(uint)(ABS(fVar103 * fVar86) < ABS(fVar87 * fVar123));
          auVar37._12_4_ = -(uint)(ABS(fVar108 * fVar89) < ABS(fVar91 * fVar124));
          local_9c8 = blendvps(auVar85,auVar80,auVar37);
          auVar78._0_4_ = fVar70 * fVar40 - fVar72 * fVar132;
          auVar78._4_4_ = fVar74 * fVar41 - fVar75 * fVar133;
          auVar78._8_4_ = fVar86 * fVar42 - fVar87 * fVar134;
          auVar78._12_4_ = fVar89 * fVar43 - fVar91 * fVar135;
          auVar152._0_4_ = fVar72 * fVar73 - fVar40 * fVar59;
          auVar152._4_4_ = fVar75 * fVar81 - fVar41 * fVar60;
          auVar152._8_4_ = fVar87 * fVar88 - fVar42 * fVar62;
          auVar152._12_4_ = fVar91 * fVar92 - fVar43 * fVar69;
          auVar38._4_4_ = -(uint)(ABS(fVar75 * fVar133) < ABS(fVar41 * fVar60));
          auVar38._0_4_ = -(uint)(ABS(fVar72 * fVar132) < ABS(fVar40 * fVar59));
          fVar59 = (float)DAT_01f7ba10;
          fVar60 = DAT_01f7ba10._4_4_;
          fVar70 = DAT_01f7ba10._12_4_;
          auVar38._8_4_ = -(uint)(ABS(fVar87 * fVar134) < ABS(fVar42 * fVar62));
          auVar38._12_4_ = -(uint)(ABS(fVar91 * fVar135) < ABS(fVar43 * fVar69));
          local_9b8 = blendvps(auVar152,auVar78,auVar38);
          fVar42 = fVar61 * local_9d8._0_4_ + fVar113 * local_9c8._0_4_ + fVar71 * local_9b8._0_4_;
          fVar43 = fVar61 * local_9d8._4_4_ + fVar113 * local_9c8._4_4_ + fVar71 * local_9b8._4_4_;
          fVar62 = fVar61 * local_9d8._8_4_ + fVar113 * local_9c8._8_4_ + fVar71 * local_9b8._8_4_;
          fVar69 = fVar61 * local_9d8._12_4_ +
                   fVar113 * local_9c8._12_4_ + fVar71 * local_9b8._12_4_;
          fVar42 = fVar42 + fVar42;
          fVar43 = fVar43 + fVar43;
          fVar62 = fVar62 + fVar62;
          fVar69 = fVar69 + fVar69;
          auVar55._0_4_ = fVar93 * local_9b8._0_4_;
          auVar55._4_4_ = fVar96 * local_9b8._4_4_;
          auVar55._8_4_ = fVar97 * local_9b8._8_4_;
          auVar55._12_4_ = fVar98 * local_9b8._12_4_;
          fVar82 = fVar114 * local_9d8._0_4_ + fVar126 * local_9c8._0_4_ + auVar55._0_4_;
          fVar27 = fVar115 * local_9d8._4_4_ + fVar127 * local_9c8._4_4_ + auVar55._4_4_;
          fVar40 = fVar119 * local_9d8._8_4_ + fVar130 * local_9c8._8_4_ + auVar55._8_4_;
          fVar41 = fVar120 * local_9d8._12_4_ + fVar131 * local_9c8._12_4_ + auVar55._12_4_;
          auVar13._4_4_ = fVar43;
          auVar13._0_4_ = fVar42;
          auVar13._8_4_ = fVar62;
          auVar13._12_4_ = fVar69;
          auVar28 = rcpps(auVar55,auVar13);
          fVar113 = auVar28._0_4_;
          fVar71 = auVar28._4_4_;
          fVar125 = auVar28._8_4_;
          fVar155 = auVar28._12_4_;
          fVar61 = DAT_01f7ba10._8_4_;
          local_978._0_4_ = ((fVar59 - fVar42 * fVar113) * fVar113 + fVar113) * (fVar82 + fVar82);
          local_978._4_4_ = ((fVar60 - fVar43 * fVar71) * fVar71 + fVar71) * (fVar27 + fVar27);
          fStack_970 = ((fVar61 - fVar62 * fVar125) * fVar125 + fVar125) * (fVar40 + fVar40);
          fStack_96c = ((fVar70 - fVar69 * fVar155) * fVar155 + fVar155) * (fVar41 + fVar41);
          fVar113 = *(float *)(ray + k * 4 + 0x80);
          fVar71 = *(float *)(ray + k * 4 + 0x30);
          auVar67._4_4_ = -(uint)(fVar71 <= (float)local_978._4_4_);
          auVar67._0_4_ = -(uint)(fVar71 <= (float)local_978._0_4_);
          auVar67._8_4_ = -(uint)(fVar71 <= fStack_970);
          auVar67._12_4_ = -(uint)(fVar71 <= fStack_96c);
          auVar56._0_4_ =
               -(uint)((float)local_978._0_4_ <= fVar113 && fVar71 <= (float)local_978._0_4_) &
               auVar107._0_4_;
          auVar56._4_4_ =
               -(uint)((float)local_978._4_4_ <= fVar113 && fVar71 <= (float)local_978._4_4_) &
               auVar107._4_4_;
          auVar56._8_4_ = -(uint)(fStack_970 <= fVar113 && fVar71 <= fStack_970) & auVar107._8_4_;
          auVar56._12_4_ = -(uint)(fStack_96c <= fVar113 && fVar71 <= fStack_96c) & auVar107._12_4_;
          iVar16 = movmskps(iVar16,auVar56);
          if (iVar16 != 0) {
            local_9a8._0_4_ = auVar56._0_4_ & -(uint)(fVar42 != 0.0);
            local_9a8._4_4_ = auVar56._4_4_ & -(uint)(fVar43 != 0.0);
            local_9a8._8_4_ = auVar56._8_4_ & -(uint)(fVar62 != 0.0);
            local_9a8._12_4_ = auVar56._12_4_ & -(uint)(fVar69 != 0.0);
            uVar19 = movmskps(iVar16,local_9a8);
            if (uVar19 != 0) {
              local_9f8 = auVar77._0_4_;
              fStack_9f4 = auVar77._4_4_;
              fStack_9f0 = auVar77._8_4_;
              fStack_9ec = auVar77._12_4_;
              _local_9e8 = _local_af8;
              local_938._8_8_ = uVar15;
              local_938._0_8_ = uVar14;
              pSVar9 = context->scene;
              auVar28 = rcpps(auVar67,_local_af8);
              fVar71 = auVar28._0_4_;
              fVar125 = auVar28._4_4_;
              fVar155 = auVar28._8_4_;
              fVar82 = auVar28._12_4_;
              fVar71 = (float)(-(uint)(1e-18 <= ABS((float)local_af8._0_4_)) &
                              (uint)((fVar59 - (float)local_af8._0_4_ * fVar71) * fVar71 + fVar71));
              fVar125 = (float)(-(uint)(1e-18 <= ABS((float)local_af8._4_4_)) &
                               (uint)((fVar60 - (float)local_af8._4_4_ * fVar125) * fVar125 +
                                     fVar125));
              fVar155 = (float)(-(uint)(1e-18 <= ABS(fStack_af0)) &
                               (uint)((fVar61 - fStack_af0 * fVar155) * fVar155 + fVar155));
              fVar82 = (float)(-(uint)(1e-18 <= ABS(fStack_aec)) &
                              (uint)((fVar70 - fStack_aec * fVar82) * fVar82 + fVar82));
              auVar118._0_4_ = fVar99 * fVar71;
              auVar118._4_4_ = fVar100 * fVar125;
              auVar118._8_4_ = (float)local_a08._8_4_ * fVar155;
              auVar118._12_4_ = fStack_9fc * fVar82;
              auVar46 = minps(auVar118,_DAT_01f7ba10);
              auVar95._0_4_ = fVar71 * auVar77._0_4_;
              auVar95._4_4_ = fVar125 * auVar77._4_4_;
              auVar95._8_4_ = fVar155 * auVar77._8_4_;
              auVar95._12_4_ = fVar82 * auVar77._12_4_;
              auVar28 = minps(auVar95,_DAT_01f7ba10);
              auVar57._0_4_ = fVar59 - auVar46._0_4_;
              auVar57._4_4_ = fVar60 - auVar46._4_4_;
              auVar57._8_4_ = fVar61 - auVar46._8_4_;
              auVar57._12_4_ = fVar70 - auVar46._12_4_;
              auVar68._0_4_ = fVar59 - auVar28._0_4_;
              auVar68._4_4_ = fVar60 - auVar28._4_4_;
              auVar68._8_4_ = fVar61 - auVar28._8_4_;
              auVar68._12_4_ = fVar70 - auVar28._12_4_;
              local_998 = blendvps(auVar46,auVar57,local_938);
              local_988 = blendvps(auVar28,auVar68,local_938);
              local_968 = local_9d8;
              local_958 = local_9c8;
              local_948 = local_9b8;
              uVar17 = (ulong)(uVar19 & 0xff);
              do {
                uVar21 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                local_8c8 = *(uint *)(local_b58[0xc] + uVar21 * 4);
                pGVar10 = (pSVar9->geometries).items[local_8c8].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00277d76:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar26;
                  }
                  local_8f8 = *(undefined4 *)(local_998 + uVar21 * 4);
                  uVar7 = *(undefined4 *)(local_988 + uVar21 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_978 + uVar21 * 4);
                  args.context = context->user;
                  local_8d8 = *(undefined4 *)((long)&local_a18 + uVar21 * 4);
                  local_8e8._4_4_ = uVar7;
                  local_8e8._0_4_ = uVar7;
                  local_8e8._8_4_ = uVar7;
                  local_8e8._12_4_ = uVar7;
                  local_928 = *(undefined4 *)(local_968 + uVar21 * 4);
                  local_918._4_4_ = *(undefined4 *)(local_958 + uVar21 * 4);
                  uVar7 = *(undefined4 *)(local_948 + uVar21 * 4);
                  local_908._4_4_ = uVar7;
                  local_908._0_4_ = uVar7;
                  local_908._8_4_ = uVar7;
                  local_908._12_4_ = uVar7;
                  uStack_924 = local_928;
                  uStack_920 = local_928;
                  uStack_91c = local_928;
                  local_918._0_4_ = local_918._4_4_;
                  local_918._8_4_ = local_918._4_4_;
                  local_918._12_4_ = local_918._4_4_;
                  uStack_8f4 = local_8f8;
                  uStack_8f0 = local_8f8;
                  uStack_8ec = local_8f8;
                  uStack_8d4 = local_8d8;
                  uStack_8d0 = local_8d8;
                  uStack_8cc = local_8d8;
                  uStack_8c4 = local_8c8;
                  uStack_8c0 = local_8c8;
                  uStack_8bc = local_8c8;
                  local_8b8 = (args.context)->instID[0];
                  uStack_8b4 = local_8b8;
                  uStack_8b0 = local_8b8;
                  uStack_8ac = local_8b8;
                  local_8a8 = (args.context)->instPrimID[0];
                  uStack_8a4 = local_8a8;
                  uStack_8a0 = local_8a8;
                  uStack_89c = local_8a8;
                  local_b68 = *local_b40;
                  args.valid = (int *)local_b68;
                  args.geometryUserPtr = pGVar10->userPtr;
                  args.hit = (RTCHitN *)&local_928;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&args);
                  }
                  if (local_b68 == (undefined1  [16])0x0) {
                    auVar58._8_4_ = 0xffffffff;
                    auVar58._0_8_ = 0xffffffffffffffff;
                    auVar58._12_4_ = 0xffffffff;
                    auVar58 = auVar58 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&args);
                    }
                    auVar39._0_4_ = -(uint)(local_b68._0_4_ == 0);
                    auVar39._4_4_ = -(uint)(local_b68._4_4_ == 0);
                    auVar39._8_4_ = -(uint)(local_b68._8_4_ == 0);
                    auVar39._12_4_ = -(uint)(local_b68._12_4_ == 0);
                    auVar58 = auVar39 ^ _DAT_01f7ae20;
                    auVar28 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar39
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar28;
                  }
                  if ((_DAT_01f7bb20 & auVar58) != (undefined1  [16])0x0) goto LAB_00277d76;
                  *(float *)(ray + k * 4 + 0x80) = fVar113;
                  lVar18 = local_b48;
                }
                uVar17 = uVar17 ^ 1L << (uVar21 & 0x3f);
              } while (uVar17 != 0);
            }
          }
        }
        local_b48 = lVar18 + 1;
      } while (local_b48 != local_b50);
    }
LAB_00277d56:
    bVar26 = pNVar22 != stack;
    if (!bVar26) {
      return bVar26;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }